

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O0

void GPU_MatrixRotate(float *result,float degrees,float x,float y,float z)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float local_98;
  float local_94;
  float A [16];
  float zs;
  float ys;
  float xs;
  float yzc_;
  float xyc_;
  float xzc_;
  float yc_;
  float zc_;
  float c_;
  float s;
  float c;
  float radians;
  float p;
  float z_local;
  float y_local;
  float x_local;
  float degrees_local;
  float *result_local;
  
  if (result != (float *)0x0) {
    fVar1 = sqrtf(z * z + x * x + y * y);
    fVar1 = 1.0 / fVar1;
    fVar2 = fVar1 * x;
    fVar3 = fVar1 * y;
    fVar1 = fVar1 * z;
    fVar4 = cosf(degrees * 0.017453292);
    fVar5 = sinf(degrees * 0.017453292);
    fVar6 = 1.0 - fVar4;
    fVar7 = fVar1 * fVar6;
    fVar8 = fVar2 * fVar3 * fVar6;
    A[0xf] = fVar1 * fVar5;
    local_98 = fVar2 * fVar2 * fVar6 + fVar4;
    local_94 = fVar8 + A[0xf];
    A[0] = fVar2 * fVar7 - fVar3 * fVar5;
    A[1] = 0.0;
    A[2] = fVar8 - A[0xf];
    A[3] = fVar3 * fVar3 * fVar6 + fVar4;
    A[4] = fVar3 * fVar7 + fVar2 * fVar5;
    A[5] = 0.0;
    A[6] = fVar2 * fVar7 + fVar3 * fVar5;
    A[7] = fVar3 * fVar7 - fVar2 * fVar5;
    A[8] = fVar1 * fVar7 + fVar4;
    A[9] = 0.0;
    A[10] = 0.0;
    A[0xb] = 0.0;
    A[0xc] = 0.0;
    A[0xd] = 1.0;
    GPU_MultiplyAndAssign(result,&local_98);
  }
  return;
}

Assistant:

void GPU_MatrixRotate(float* result, float degrees, float x, float y, float z)
{
	float p, radians, c, s, c_, zc_, yc_, xzc_, xyc_, yzc_, xs, ys, zs;

    if(result == NULL)
		return;

    p = 1/sqrtf(x*x + y*y + z*z);
    x *= p; y *= p; z *= p;
    radians = degrees * RAD_PER_DEG;
    c = cosf(radians);
    s = sinf(radians);
    c_ = 1 - c;
    zc_ = z*c_;
    yc_ = y*c_;
    xzc_ = x*zc_;
    xyc_ = x*y*c_;
    yzc_ = y*zc_;
    xs = x*s;
    ys = y*s;
    zs = z*s;

	{
#ifdef ROW_MAJOR
		float A[16];
		FILL_MATRIX_4x4(A,
				x*x*c_ + c,  xyc_ - zs,   xzc_ + ys, 0,
				xyc_ + zs,   y*yc_ + c,   yzc_ - xs, 0,
				xzc_ - ys,   yzc_ + xs,   z*zc_ + c, 0,
				0,           0,           0,         1
			);
#else
		float A[16];
		FILL_MATRIX_4x4(A,
				x*x*c_ + c, xyc_ + zs, xzc_ - ys, 0,
				xyc_ - zs, y*yc_ + c, yzc_ + xs, 0,
				xzc_ + ys, yzc_ - xs, z*zc_ + c, 0,
				0, 0, 0, 1
			);
#endif

		GPU_MultiplyAndAssign(result, A);
	}
}